

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

uint32_t tinyusdz::detail::to_codepoint(char *s,uint32_t *char_len)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  
  if (s == (char *)0x0) {
    *char_len = 0;
    return 0xffffffff;
  }
  uVar1 = utf8_len(*s);
  *char_len = uVar1;
  uVar3 = 0xffffffff;
  switch(uVar1) {
  case 0:
    break;
  case 1:
    if (-1 < *s) {
      uVar3 = (int)*s;
    }
    break;
  case 2:
    if ((((byte)*s & 0xffffffe0) == 0xc0) && (((byte)s[1] & 0xffffffc0) == 0x80)) {
      uVar3 = (byte)s[1] & 0x3f | ((byte)*s & 0x1f) << 6;
    }
    break;
  case 3:
    if ((*s & 0xf0U) != 0xe0) {
      return 0xffffffff;
    }
    if (((byte)s[1] & 0xffffffc0) != 0x80) {
      return 0xffffffff;
    }
    if (((byte)s[2] & 0xffffffc0) != 0x80) {
      return 0xffffffff;
    }
    uVar2 = (uint)(ushort)((ushort)(byte)*s << 0xc);
    uVar4 = ((byte)s[1] & 0x3f) << 6;
    uVar5 = (byte)s[2] & 0x3f;
    goto LAB_0021669e;
  case 4:
    if ((*s & 0xf8U) != 0xf0) {
      return 0xffffffff;
    }
    if (((byte)s[1] & 0xffffffc0) != 0x80) {
      return 0xffffffff;
    }
    if ((s[2] & 0xc0U) != 0x80) {
      return 0xffffffff;
    }
    uVar4 = ((byte)s[1] & 0x3f) << 0xc;
    uVar2 = (byte)s[3] & 0x3f;
    uVar5 = ((uint)(byte)s[2] << 6 | (uint)(byte)*s << 0x12) & 0x1c0fc0;
LAB_0021669e:
    uVar3 = uVar5 | uVar2 | uVar4;
    break;
  default:
    *char_len = 0;
  }
  return uVar3;
}

Assistant:

inline uint32_t to_codepoint(const char *s, uint32_t &char_len) {
  if (!s) {
    char_len = 0;
    return ~0u;
  }

  char_len = detail::utf8_len(static_cast<unsigned char>(s[0]));
  if (char_len == 0) {
    return ~0u;
  }

  uint32_t code = 0;
  if (char_len == 1) {
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    if (s0 > 0x7f) {
      return ~0u;
    }
    code = uint32_t(s0) & 0x7f;
  } else if (char_len == 2) {
    // 11bit: 110y-yyyx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);

    if (((s0 & 0xe0) == 0xc0) && ((s1 & 0xc0) == 0x80)) {
      code = (uint32_t(s0 & 0x1f) << 6) | (s1 & 0x3f);
    } else {
      return ~0u;
    }
  } else if (char_len == 3) {
    // 16bit: 1110-yyyy 10yx-xxxx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);
    unsigned char s2 = static_cast<unsigned char>(s[2]);
    if (((s0 & 0xf0) == 0xe0) && ((s1 & 0xc0) == 0x80) &&
        ((s2 & 0xc0) == 0x80)) {
      code =
          (uint32_t(s0 & 0xf) << 12) | (uint32_t(s1 & 0x3f) << 6) | (s2 & 0x3f);
    } else {
      return ~0u;
    }
  } else if (char_len == 4) {
    // 21bit: 1111-0yyy 10yy-xxxx 10xx-xxxx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);
    unsigned char s2 = static_cast<unsigned char>(s[2]);
    unsigned char s3 = static_cast<unsigned char>(s[3]);
    if (((s0 & 0xf8) == 0xf0) && ((s1 & 0xc0) == 0x80) &&
        ((s2 & 0xc0) == 0x80) && ((s2 & 0xc0) == 0x80)) {
      code = (uint32_t(s0 & 0x7) << 18) | (uint32_t(s1 & 0x3f) << 12) |
             (uint32_t(s2 & 0x3f) << 6) | uint32_t(s3 & 0x3f);
    } else {
      return ~0u;
    }
  } else {
    // ???
    char_len = 0;
    return ~0u;
  }

  return code;
}